

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O2

function<void_()> * __thiscall
Console::bindCallback<std::__cxx11::string,std::__cxx11::string>
          (function<void_()> *__return_storage_ptr__,Console *this,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,int argumentIndex)

{
  const_reference pvVar1;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  nextCallback;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  undefined1 local_c0 [32];
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_a0;
  string local_80 [32];
  undefined1 local_60 [64];
  
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)callback,(long)(int)arguments);
  std::__cxx11::string::string(local_80,(string *)pvVar1);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)local_60,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)this);
  std::__cxx11::string::string((string *)(local_60 + 0x20),local_80);
  std::function<void(std::__cxx11::string)>::
  function<Console::bindCallback<std::__cxx11::string,std::__cxx11::string>(std::function<void(std::__cxx11::string,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)::_lambda(std::__cxx11::string)_1_,void>
            ((function<void(std::__cxx11::string)> *)(local_c0 + 0x20),
             (anon_class_64_2_4fe94ccd *)local_60);
  bindCallback<std::__cxx11::string,std::__cxx11::string>(std::function<void(std::__cxx11::string,std::__cxx11::string)>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,int)
  ::{lambda(std::__cxx11::string)#1}::~vector((_lambda_std____cxx11__string__1_ *)local_60);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)local_c0,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(local_c0 + 0x20));
  bindCallback<std::__cxx11::string>
            (__return_storage_ptr__,(Console *)local_c0,
             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)callback,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(ulong)((int)arguments + 1),argumentIndex);
  std::_Function_base::~_Function_base((_Function_base *)local_c0);
  std::_Function_base::~_Function_base((_Function_base *)(local_c0 + 0x20));
  std::__cxx11::string::~string(local_80);
  return __return_storage_ptr__;
}

Assistant:

std::function<void()> Console::bindCallback(std::function<void(T, Args...)> callback, const std::vector<std::string> &arguments, int argumentIndex)
{
    T value = argumentConverter<T>::convert(arguments.at(argumentIndex));
    std::function<void(Args...)> nextCallback = [callback, value](Args... args) {
        callback(value, args...);
    };
    return bindCallback(nextCallback, arguments, argumentIndex + 1);
}